

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bidi.c
# Opt level: O1

void do_bidi_new(BidiContext *ctx,bidi_char *text,size_t textlen)

{
  long *plVar1;
  size_t *psVar2;
  byte *pbVar3;
  undefined4 uVar4;
  BidiType *pBVar5;
  size_t sVar6;
  bidi_char *pbVar7;
  size_t sVar8;
  int iVar9;
  BidiType BVar10;
  uint uVar11;
  uchar uVar12;
  BidiType *pBVar13;
  uchar *puVar14;
  size_t *psVar15;
  _Bool *p_Var16;
  IsolatingRunSequence *pIVar17;
  byte bVar18;
  DirectionalOverride DVar19;
  BidiType BVar20;
  size_t *psVar21;
  size_t sVar22;
  ulong uVar23;
  size_t sVar24;
  byte bVar25;
  ulong uVar26;
  ulong uVar27;
  long lVar28;
  uint uVar29;
  size_t sVar30;
  uint *puVar31;
  byte bVar32;
  int iVar33;
  undefined8 uVar34;
  int iVar35;
  BidiType BVar36;
  BidiType BVar37;
  size_t sVar38;
  size_t sVar39;
  ulong uVar40;
  int iVar41;
  size_t sVar42;
  size_t *psVar43;
  size_t sVar44;
  uint counter_1;
  BidiType BVar45;
  ulong uVar46;
  ulong uVar47;
  long lVar48;
  bool bVar49;
  bool bVar50;
  
  if (ctx->internal_array_sizes < textlen) {
    ctx->internal_array_sizes = textlen;
    pBVar13 = (BidiType *)saferealloc(ctx->types,textlen,4);
    ctx->types = pBVar13;
    pBVar13 = (BidiType *)saferealloc(ctx->origTypes,ctx->internal_array_sizes,4);
    ctx->origTypes = pBVar13;
    puVar14 = (uchar *)saferealloc(ctx->levels,ctx->internal_array_sizes,1);
    ctx->levels = puVar14;
    psVar15 = (size_t *)saferealloc(ctx->irsindices,ctx->internal_array_sizes,8);
    ctx->irsindices = psVar15;
    p_Var16 = (_Bool *)saferealloc(ctx->irsdone,ctx->internal_array_sizes,1);
    ctx->irsdone = p_Var16;
    psVar15 = (size_t *)saferealloc(ctx->bracketpos,ctx->internal_array_sizes,8);
    ctx->bracketpos = psVar15;
  }
  ctx->text = text;
  ctx->textlen = textlen;
  if (textlen != 0) {
    pBVar13 = ctx->types;
    pBVar5 = ctx->origTypes;
    sVar22 = 0;
    do {
      iVar35 = -1;
      iVar33 = 0x510;
      do {
        iVar41 = (iVar35 + iVar33) / 2;
        iVar9 = iVar41;
        if ((bidi_getType::lookup[iVar41].first <= (int)text[sVar22].wc) &&
           (iVar9 = iVar33, iVar35 = iVar41,
           (int)text[sVar22].wc <= bidi_getType::lookup[iVar41].last)) {
          BVar20 = (BidiType)(byte)bidi_getType::lookup[iVar41].type;
          goto LAB_0010236a;
        }
        iVar33 = iVar9;
      } while (1 < iVar33 - iVar35);
      BVar20 = ON;
LAB_0010236a:
      pBVar5[sVar22] = BVar20;
      pBVar13[sVar22] = BVar20;
      sVar22 = sVar22 + 1;
    } while (sVar22 != textlen);
  }
  if (textlen != 0) {
    if ((0x83f6U >> (*ctx->types & (CS|AN)) & 1) != 0) goto LAB_001023ba;
    uVar23 = 0;
    do {
      if (textlen - 1 == uVar23) goto LAB_001023a9;
      lVar48 = uVar23 + 1;
      uVar23 = uVar23 + 1;
    } while ((0x83f6U >> (ctx->types[lVar48] & (CS|AN)) & 1) == 0);
    if (uVar23 < textlen) goto LAB_001023ba;
  }
LAB_001023a9:
  if ((0x83f6U >> (ctx->paragraphOverride & (CS|AN)) & 1) == 0) {
    return;
  }
LAB_001023ba:
  if (ctx->paragraphOverride == L) {
    uVar12 = '\0';
  }
  else if (ctx->paragraphOverride == R) {
    uVar12 = '\x01';
  }
  else {
    uVar12 = rule_p2_p3(ctx->types,textlen);
  }
  ctx->paragraphLevel = uVar12;
  ctx->ds_sp = 0;
  ctx->dsstack[0].level = uVar12;
  ctx->dsstack[0].override = DO_NEUTRAL;
  ctx->dsstack[0].isolate = false;
  ctx->overflowIsolateCount = 0;
  ctx->overflowEmbeddingCount = 0;
  ctx->validIsolateCount = 0;
  if (textlen != 0) {
    psVar15 = &ctx->ds_sp;
    psVar43 = &ctx->overflowIsolateCount;
    psVar2 = &ctx->overflowEmbeddingCount;
    uVar23 = 1;
    uVar47 = 0;
    do {
      pBVar13 = ctx->types;
      BVar20 = pBVar13[uVar47];
      uVar46 = (ulong)(BVar20 - LRE);
      if (0x12 < BVar20 - LRE) goto switchD_00102473_caseD_3;
      uVar26 = (long)&switchD_00102473::switchdataD_001042a8 +
               (long)(int)(&switchD_00102473::switchdataD_001042a8)[uVar46];
      switch(uVar46) {
      case 0:
      case 1:
      case 5:
      case 6:
        ctx->levels[uVar47] = ctx->dsstack[ctx->ds_sp].level;
        switch(uVar46) {
        case 0:
          bVar25 = (ctx->dsstack[ctx->ds_sp].level | 1) + 1;
          goto LAB_001025ee;
        case 1:
          bVar25 = (ctx->dsstack[ctx->ds_sp].level | 1) + 1;
          DVar19 = DO_LTR;
          break;
        default:
          __assert_fail("false && \"how did this get past the outer switch?\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/terminal/bidi.c"
                        ,0xa95,"void process_explicit_embeddings(BidiContext *)");
        case 5:
          bVar25 = ctx->dsstack[ctx->ds_sp].level + 1 | 1;
LAB_001025ee:
          DVar19 = DO_NEUTRAL;
          break;
        case 6:
          bVar25 = ctx->dsstack[ctx->ds_sp].level + 1 | 1;
          DVar19 = DO_RTL;
        }
        if (((bVar25 < 0x7e) && (*psVar43 == 0)) && (*psVar2 == 0)) {
          sVar22 = *psVar15;
          *psVar15 = sVar22 + 1;
          if (0x7e < sVar22 + 1) goto LAB_001033a0;
          ctx->dsstack[sVar22 + 1].level = bVar25;
          ctx->dsstack[sVar22 + 1].override = DVar19;
          ctx->dsstack[sVar22 + 1].isolate = false;
        }
        else if (*psVar43 == 0) {
          *psVar2 = *psVar2 + 1;
        }
        break;
      case 8:
        if ((*psVar43 == 0) &&
           ((sVar22 = *psVar2, psVar21 = psVar2, sVar22 != 0 ||
            ((sVar22 = *psVar15, sVar22 != 0 &&
             (psVar21 = psVar15, ctx->dsstack[sVar22].isolate == false)))))) {
          *psVar21 = sVar22 - 1;
        }
      case 0x11:
        uVar12 = ctx->dsstack[ctx->ds_sp].level;
LAB_0010252c:
        ctx->levels[uVar47] = uVar12;
        break;
      case 9:
        sVar22 = *psVar43;
        psVar21 = psVar43;
        if (sVar22 == 0) {
          sVar22 = ctx->validIsolateCount;
          if (sVar22 == 0) goto switchD_00102473_caseD_3;
          ctx->overflowEmbeddingCount = 0;
          sVar44 = ctx->ds_sp;
          sVar24 = sVar44;
          if (ctx->dsstack[sVar44].isolate == false) {
            do {
              sVar44 = sVar24 - 1;
              if (sVar24 == 0) goto LAB_00103324;
              ctx->ds_sp = sVar44;
              lVar48 = sVar24 - 1;
              sVar24 = sVar44;
            } while (ctx->dsstack[lVar48].isolate != true);
          }
          if (sVar44 == 0) {
LAB_00103324:
            __assert_fail("ctx->ds_sp > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/terminal/bidi.c"
                          ,0xa66,"void pop(BidiContext *)");
          }
          *psVar15 = sVar44 - 1;
          psVar21 = &ctx->validIsolateCount;
        }
        *psVar21 = sVar22 - 1;
      default:
switchD_00102473_caseD_3:
        ctx->levels[uVar47] = ctx->dsstack[ctx->ds_sp].level;
        DVar19 = ctx->dsstack[ctx->ds_sp].override;
        if (DVar19 != DO_NEUTRAL) {
          ctx->types[uVar47] = (uint)(DVar19 != DO_LTR) << 2;
        }
        break;
      case 10:
        iVar35 = 1;
        uVar46 = uVar23;
        do {
          uVar27 = textlen;
          if (textlen <= uVar46) break;
          if ((0x908U >> (pBVar13[uVar46] & (CS|AN)) & 1) == 0) {
            bVar50 = true;
            if ((pBVar13[uVar46] == PDI) && (iVar35 = iVar35 + -1, iVar35 == 0)) {
              iVar35 = 0;
              bVar50 = false;
              uVar26 = uVar46;
            }
          }
          else {
            iVar35 = iVar35 + 1;
            bVar50 = true;
          }
          uVar46 = uVar46 + 1;
          uVar27 = uVar26;
        } while (bVar50);
        uVar12 = rule_p2_p3(pBVar13 + uVar47 + 1,uVar27 - (uVar47 + 1));
        BVar20 = (uint)(uVar12 == '\x01') * 5 + LRI;
      case 2:
      case 7:
        ctx->levels[uVar47] = ctx->dsstack[ctx->ds_sp].level;
        sVar22 = ctx->ds_sp;
        DVar19 = ctx->dsstack[sVar22].override;
        if (DVar19 != DO_NEUTRAL) {
          BVar36 = L;
          if ((DVar19 != DO_LTR) && (BVar36 = BVar20, DVar19 == DO_RTL)) {
            BVar36 = R;
          }
          ctx->types[uVar47] = BVar36;
        }
        bVar25 = ctx->dsstack[sVar22].level;
        bVar18 = (bVar25 | 1) + 1;
        if (BVar20 == RLI) {
          bVar18 = bVar25 + 1 | 1;
        }
        if (((bVar18 < 0x7e) && (*psVar43 == 0)) && (*psVar2 == 0)) {
          *psVar15 = sVar22 + 1;
          if (0x7e < sVar22 + 1) {
LAB_001033a0:
            __assert_fail("ctx->ds_sp < lenof(ctx->dsstack)",
                          "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/terminal/bidi.c"
                          ,0xa5e,
                          "void push(BidiContext *, unsigned char, DirectionalOverride, _Bool)");
          }
          ctx->dsstack[sVar22 + 1].level = bVar18;
          ctx->dsstack[sVar22 + 1].override = DO_NEUTRAL;
          ctx->dsstack[sVar22 + 1].isolate = true;
          ctx->validIsolateCount = ctx->validIsolateCount + 1;
        }
        else {
          *psVar43 = *psVar43 + 1;
        }
        break;
      case 0x12:
        if (uVar47 != textlen - 1) {
          __assert_fail("i == ctx->textlen - 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/terminal/bidi.c"
                        ,0xaf5,"void process_explicit_embeddings(BidiContext *)");
        }
        uVar12 = ctx->paragraphLevel;
        goto LAB_0010252c;
      }
      uVar47 = uVar47 + 1;
      textlen = ctx->textlen;
      uVar23 = uVar23 + 1;
    } while (uVar47 < textlen);
  }
  if (ctx->textlen != 0) {
    uVar23 = 0;
    do {
      pBVar13 = ctx->types;
      if ((((0x402c6U >> (pBVar13[uVar23] & (CS|AN)) & 1) != 0) &&
          (pBVar13[uVar23] = BN, uVar23 != 0)) && (pBVar13[uVar23 - 1] == BN)) {
        ctx->levels[uVar23] = ctx->levels[uVar23 - 1];
      }
      uVar23 = uVar23 + 1;
    } while (uVar23 < ctx->textlen);
  }
  memset(ctx->irsdone,0,ctx->textlen);
  uVar23 = ctx->textlen;
  if (uVar23 == 0) {
    sVar22 = 0;
  }
  else {
    uVar47 = 0;
    sVar24 = 0;
    sVar44 = 0;
    do {
      while (ctx->irsdone[uVar47] == true) {
        uVar47 = uVar47 + 1;
        sVar22 = sVar44;
        if (uVar23 <= uVar47) goto LAB_001029ce;
      }
      pIVar17 = (IsolatingRunSequence *)
                safegrowarray(ctx->irslist,&ctx->irslistsize,0x20,sVar44,1,false);
      ctx->irslist = pIVar17;
      pIVar17[sVar44].start = sVar24;
      puVar14 = ctx->levels;
      bVar25 = puVar14[uVar47];
      sVar22 = uVar47;
      if (uVar47 < ctx->textlen) {
        do {
          if (puVar14[sVar22] != bVar25) {
            __assert_fail("ctx->levels[j] == irslevel",
                          "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/terminal/bidi.c"
                          ,0xb90,"void find_isolating_run_sequences(BidiContext *, irs_fn_t)");
          }
          psVar15 = ctx->irsindices;
          p_Var16 = ctx->irsdone;
          sVar30 = sVar22;
          sVar38 = sVar24;
          do {
            sVar42 = sVar30;
            sVar22 = sVar22 + 1;
            sVar24 = sVar38 + 1;
            p_Var16[sVar42] = true;
            psVar15[sVar38] = sVar42;
            uVar23 = ctx->textlen;
            if (uVar23 <= sVar42 + 1) break;
            sVar30 = sVar42 + 1;
            sVar38 = sVar24;
          } while (puVar14[sVar42 + 1] == bVar25);
          BVar20 = ctx->types[sVar42];
          uVar46 = (ulong)BVar20;
          if ((0x908U >> (BVar20 & (CS|AN)) & 1) == 0) break;
          iVar35 = 1;
          do {
            uVar26 = uVar23;
            if (uVar23 <= sVar22) break;
            BVar20 = ctx->types[sVar22];
            if ((0x908U >> (BVar20 & (CS|AN)) & 1) == 0) {
              bVar50 = true;
              if ((BVar20 == PDI) && (iVar35 = iVar35 + -1, iVar35 == 0)) {
                iVar35 = 0;
                bVar50 = false;
                uVar46 = sVar22;
              }
            }
            else {
              iVar35 = iVar35 + 1;
              bVar50 = true;
            }
            sVar22 = sVar22 + 1;
            uVar26 = uVar46;
          } while (bVar50);
          sVar22 = uVar26;
        } while (uVar26 < uVar23);
      }
      sVar22 = sVar44 + 1;
      pIVar17[sVar44].end = sVar24;
      bVar18 = ctx->paragraphLevel;
      uVar23 = uVar47;
      do {
        bVar50 = uVar23 == 0;
        uVar23 = uVar23 - 1;
        bVar32 = bVar18;
        if (bVar50) goto LAB_00102934;
      } while (ctx->types[uVar23] == BN);
      bVar32 = puVar14[uVar23];
LAB_00102934:
      if (bVar32 < puVar14[uVar47]) {
        bVar32 = puVar14[uVar47];
      }
      pIVar17[sVar44].sos = (uint)(byte)((bVar32 & 1) << 2);
      sVar38 = ctx->irsindices[sVar24 - 1];
      pbVar3 = puVar14 + sVar38;
      if ((0x908U >> (ctx->types[sVar38] & (CS|AN)) & 1) == 0) {
        do {
          sVar38 = sVar38 + 1;
          if (ctx->textlen <= sVar38) goto LAB_0010298c;
        } while (ctx->types[sVar38] == BN);
        bVar18 = puVar14[sVar38];
      }
LAB_0010298c:
      if (bVar18 < *pbVar3) {
        bVar18 = *pbVar3;
      }
      pIVar17[sVar44].eos = (uint)(byte)((bVar18 & 1) << 2);
      pIVar17[sVar44].embeddingDirection = (bVar25 & 1) << 2;
      uVar23 = ctx->textlen;
      sVar44 = sVar22;
    } while (uVar47 < uVar23);
  }
LAB_001029ce:
  if (sVar22 != 0) {
    sVar44 = 0;
    do {
      psVar43 = ctx->irsindices;
      pIVar17 = ctx->irslist;
      sVar24 = pIVar17[sVar44].start;
      psVar15 = psVar43 + sVar24;
      ctx->irs = psVar15;
      sVar38 = pIVar17[sVar44].end;
      sVar30 = sVar38 - sVar24;
      ctx->irslen = sVar30;
      BVar20 = pIVar17[sVar44].sos;
      ctx->sos = BVar20;
      ctx->eos = pIVar17[sVar44].eos;
      ctx->embeddingDirection = pIVar17[sVar44].embeddingDirection;
      if (sVar30 == 0) {
        bVar50 = false;
      }
      else {
        pBVar13 = ctx->types;
        sVar42 = sVar24;
        do {
          BVar36 = pBVar13[psVar43[sVar42]];
          if (BVar36 == NSM) {
            pBVar13[psVar43[sVar42]] = BVar20;
            BVar37 = BVar20;
          }
          else {
            BVar37 = ON;
            if (((0xd08U >> (BVar36 & (CS|AN)) & 1) == 0) && (BVar37 = BVar20, BVar36 != BN)) {
              BVar37 = BVar36;
            }
          }
          BVar20 = BVar37;
          sVar42 = sVar42 + 1;
        } while (sVar38 != sVar42);
        BVar20 = ctx->sos;
        sVar42 = sVar24;
        do {
          BVar36 = pBVar13[psVar43[sVar42]];
          if ((BVar36 == EN) && (BVar20 == AL)) {
            pBVar13[psVar43[sVar42]] = AN;
            BVar20 = AL;
          }
          else if ((0x31U >> (BVar36 & (CS|AN)) & 1) != 0) {
            BVar20 = BVar36;
          }
          sVar42 = sVar42 + 1;
          sVar39 = sVar24;
        } while (sVar38 != sVar42);
        do {
          if (pBVar13[psVar43[sVar39]] == AL) {
            pBVar13[psVar43[sVar39]] = R;
          }
          sVar39 = sVar39 + 1;
        } while (sVar38 != sVar39);
        sVar39 = 0;
        BVar36 = ON;
        sVar42 = sVar24;
        BVar20 = ON;
        do {
          sVar6 = psVar43[sVar42];
          BVar37 = pBVar13[sVar6];
          sVar8 = sVar39;
          BVar45 = BVar20;
          BVar10 = BVar36;
          if (((BVar37 != BN) && (sVar8 = sVar6, BVar45 = BVar37, BVar10 = BVar20, BVar36 == BVar37)
              ) && ((BVar36 == EN && BVar20 == ES ||
                    ((BVar20 == CS && ((BVar36 == AN || (BVar36 == EN)))))))) {
            pBVar13[sVar39] = BVar36;
          }
          BVar36 = BVar10;
          sVar39 = sVar8;
          sVar42 = sVar42 + 1;
          BVar20 = BVar45;
        } while (sVar38 != sVar42);
        sVar42 = sVar24;
        bVar49 = false;
        do {
          bVar50 = true;
          if (pBVar13[psVar43[sVar42]] != EN) {
            if ((bVar49) && ((0x44000U >> (pBVar13[psVar43[sVar42]] & (CS|AN)) & 1) != 0)) {
              pBVar13[psVar43[sVar42]] = EN;
              bVar50 = bVar49;
            }
            else {
              bVar50 = false;
            }
          }
          sVar42 = sVar42 + 1;
          bVar49 = bVar50;
        } while (sVar38 != sVar42);
      }
      if (sVar30 == 0) {
        bVar25 = 0;
      }
      else {
        pBVar13 = ctx->types;
        sVar42 = sVar38;
        do {
          bVar49 = true;
          if (pBVar13[psVar43[sVar42 - 1]] != EN) {
            if ((bVar50) && ((0x44000U >> (pBVar13[psVar43[sVar42 - 1]] & (CS|AN)) & 1) != 0)) {
              pBVar13[psVar43[sVar42 - 1]] = EN;
              bVar49 = bVar50;
            }
            else {
              bVar49 = false;
            }
          }
          bVar50 = bVar49;
          sVar42 = sVar42 - 1;
        } while (sVar24 != sVar42);
        bVar25 = 0;
        sVar42 = sVar24;
        do {
          bVar18 = 1;
          if ((0x16000U >> (pBVar13[psVar43[sVar42]] & (CS|AN)) & 1) == 0) {
            if (pBVar13[psVar43[sVar42]] != BN || (bool)(~bVar25 & 1)) {
              bVar18 = 0;
            }
            else {
              pBVar13[psVar43[sVar42]] = CS;
              bVar18 = bVar25;
            }
          }
          bVar25 = bVar18;
          sVar42 = sVar42 + 1;
        } while (sVar38 != sVar42);
      }
      if (sVar30 != 0) {
        pBVar13 = ctx->types;
        sVar30 = sVar38;
        do {
          bVar18 = 1;
          if ((0x16000U >> (pBVar13[psVar43[sVar30 - 1]] & (CS|AN)) & 1) == 0) {
            if ((bool)(pBVar13[psVar43[sVar30 - 1]] != BN | ~bVar25)) {
              bVar18 = 0;
            }
            else {
              pBVar13[psVar43[sVar30 - 1]] = CS;
              bVar18 = bVar25;
            }
          }
          bVar25 = bVar18;
          sVar30 = sVar30 - 1;
          sVar42 = sVar24;
        } while (sVar24 != sVar30);
        do {
          if ((0x16000U >> (pBVar13[psVar43[sVar42]] & (CS|AN)) & 1) != 0) {
            pBVar13[psVar43[sVar42]] = ON;
          }
          sVar42 = sVar42 + 1;
        } while (sVar38 != sVar42);
        BVar20 = ctx->sos;
        do {
          BVar36 = pBVar13[psVar43[sVar24]];
          if ((BVar36 == EN) && (BVar20 == L)) {
            pBVar13[psVar43[sVar24]] = L;
            BVar20 = L;
          }
          else if ((0x31U >> (BVar36 & (CS|AN)) & 1) != 0) {
            BVar20 = BVar36;
          }
          sVar24 = sVar24 + 1;
        } while (sVar38 != sVar24);
        psVar43 = ctx->bracketpos;
        uVar23 = 0;
        do {
          psVar43[uVar23] = 0xffffffffffffffff;
          uVar23 = uVar23 + 1;
        } while (uVar23 < ctx->irslen);
      }
      if (ctx->irslen != 0) {
        pbVar7 = ctx->text;
        uVar23 = 0;
        uVar47 = 0;
        do {
          uVar29 = pbVar7[psVar15[uVar47]].wc;
          iVar33 = 0x80;
          iVar35 = -1;
          do {
            iVar41 = (iVar33 + iVar35) / 2;
            lVar48 = (long)iVar41 * 0x10;
            iVar9 = iVar41;
            if ((*(uint *)(bracket_type_bracket_pairs + lVar48) <= uVar29) &&
               (iVar9 = iVar33, iVar35 = iVar41,
               uVar29 <= *(uint *)(bracket_type_bracket_pairs + lVar48))) {
              uVar34 = *(undefined8 *)(bracket_type_bracket_pairs + lVar48 + 4);
              iVar35 = *(int *)(bracket_type_bracket_pairs + lVar48 + 0xc);
              goto LAB_00102da7;
            }
            iVar33 = iVar9;
          } while (1 < iVar33 - iVar35);
          uVar34 = 0;
          iVar35 = 0;
LAB_00102da7:
          if (iVar35 == 1) {
            if (uVar23 < 0x3f) {
              ctx->bstack[uVar23].ch = uVar29;
              ctx->bstack[uVar23].c = uVar47;
              uVar23 = uVar23 + 1;
              goto LAB_00102e14;
            }
            bVar50 = false;
          }
          else if (iVar35 == 2) {
            psVar43 = &ctx->bstack[uVar23].c;
            uVar46 = uVar23;
            do {
              bVar50 = true;
              bVar49 = uVar46 == 0;
              uVar46 = uVar46 - 1;
              if (bVar49) goto LAB_00102e17;
              plVar1 = (long *)(psVar43 + -3);
              psVar43 = psVar43 + -2;
            } while (((int)*plVar1 != (int)uVar34) && ((int)*plVar1 != (int)((ulong)uVar34 >> 0x20))
                    );
            ctx->bracketpos[*psVar43] = uVar47;
            uVar23 = uVar46;
          }
          else {
LAB_00102e14:
            bVar50 = true;
          }
LAB_00102e17:
        } while ((bVar50) && (uVar47 = uVar47 + 1, uVar47 < ctx->irslen));
      }
      if (ctx->irslen != 0) {
        uVar23 = 1;
        sVar24 = 0;
        do {
          uVar47 = ctx->bracketpos[sVar24];
          if (uVar47 != 0xffffffffffffffff) {
            pBVar13 = ctx->types;
            psVar15 = ctx->irs;
            if (((0x780000U >> (pBVar13[psVar15[sVar24]] & (CS|AN)) & 1) != 0) &&
               (BVar20 = pBVar13[psVar15[uVar47]], (0x780000U >> (BVar20 & (CS|AN)) & 1) != 0)) {
              bVar50 = false;
              uVar46 = uVar23;
              do {
                uVar26 = uVar46;
                if (uVar47 <= uVar26) break;
                if ((0x9031U >> (pBVar13[psVar15[uVar26]] & (CS|AN)) & 1) == 0) {
                  bVar49 = true;
                }
                else if ((uint)(pBVar13[psVar15[uVar26]] != L) << 2 == ctx->embeddingDirection) {
                  bVar49 = false;
                  BVar20 = ctx->embeddingDirection;
                }
                else {
                  bVar49 = true;
                  bVar50 = true;
                }
                uVar46 = uVar26 + 1;
              } while (bVar49);
              BVar36 = BVar20;
              if ((uVar47 <= uVar26) && (sVar38 = sVar24, BVar36 = ON, bVar50)) {
                do {
                  sVar30 = sVar38;
                  BVar36 = BVar20;
                  if (sVar30 == 0) break;
                  BVar36 = (uint)(pBVar13[psVar15[sVar30 - 1]] != L) << 2;
                  sVar38 = sVar30 - 1;
                } while ((0x9031U >> (pBVar13[psVar15[sVar30 - 1]] & (CS|AN)) & 1) == 0);
                if (sVar30 == 0) {
                  BVar36 = ctx->sos;
                }
              }
              if (BVar36 != ON) {
                reset_bracket_type(ctx,sVar24,BVar36);
                reset_bracket_type(ctx,uVar47,BVar36);
              }
            }
          }
          sVar24 = sVar24 + 1;
          uVar23 = uVar23 + 1;
        } while (sVar24 < ctx->irslen);
      }
      BVar20 = ctx->sos;
      uVar23 = ctx->irslen;
      uVar46 = 0;
      uVar47 = 0xffffffffffffffff;
      do {
        pBVar13 = &ctx->eos;
        if (uVar46 < uVar23) {
          pBVar13 = ctx->types + ctx->irs[uVar46];
        }
        BVar36 = *pBVar13;
        if ((0x9031U >> (BVar36 & (CS|AN)) & 1) == 0) {
          uVar26 = uVar47;
          if (uVar47 == 0xffffffffffffffff) {
            uVar26 = uVar46;
          }
          BVar37 = BVar20;
          if ((1 << ((byte)BVar36 & 0x1f) & 0x700d08U) == 0) {
            uVar26 = uVar47;
          }
        }
        else {
          BVar37 = (uint)(BVar36 != L) << 2;
          uVar26 = 0xffffffffffffffff;
          if (uVar47 != 0xffffffffffffffff) {
            BVar36 = BVar37;
            if (BVar37 != BVar20) {
              BVar36 = ctx->embeddingDirection;
            }
            if (uVar47 < uVar46) {
              psVar15 = ctx->irs;
              pBVar13 = ctx->types;
              do {
                if ((0x700d08U >> (pBVar13[psVar15[uVar47]] & (CS|AN)) & 1) != 0) {
                  pBVar13[psVar15[uVar47]] = BVar36;
                }
                uVar47 = uVar47 + 1;
              } while (uVar47 < uVar46);
            }
          }
        }
        BVar20 = BVar37;
        uVar46 = uVar46 + 1;
        uVar47 = uVar26;
      } while (uVar46 != uVar23 + 1 + (ulong)(uVar23 == 0xffffffffffffffff));
      if (uVar23 != 0) {
        uVar23 = 0;
        do {
          sVar24 = ctx->irs[uVar23];
          bVar25 = ctx->levels[sVar24];
          BVar20 = ctx->types[sVar24];
          if ((bVar25 & 1) == 0) {
            if ((BVar20 == AN) || (BVar20 == EN)) {
              bVar25 = bVar25 + 2;
            }
            else {
              if (BVar20 != R) goto LAB_001030bb;
              bVar25 = bVar25 | 1;
            }
LAB_001030b7:
            ctx->levels[sVar24] = bVar25;
          }
          else if ((BVar20 < CS) && ((0x9001U >> (BVar20 & (CS|AN)) & 1) != 0)) {
            bVar25 = bVar25 + 1;
            goto LAB_001030b7;
          }
LAB_001030bb:
          uVar23 = uVar23 + 1;
        } while (uVar23 < ctx->irslen);
      }
      sVar44 = sVar44 + 1;
    } while (sVar44 != sVar22);
  }
  ctx->irslen = 0;
  sVar22 = ctx->textlen;
  if (sVar22 != 0) {
    bVar50 = true;
    do {
      uVar29 = 1 << ((byte)ctx->origTypes[sVar22 - 1] & 0x1f);
      if ((0x180000U >> (ctx->origTypes[sVar22 - 1] & (CS|AN)) & 1) == 0) {
        if (bVar50) {
          if ((uVar29 & 0x200d08) == 0) {
            if ((uVar29 & 0x402c6) == 0) {
              bVar50 = false;
            }
          }
          else {
            ctx->levels[sVar22 - 1] = ctx->paragraphLevel;
          }
        }
      }
      else {
        ctx->levels[sVar22 - 1] = ctx->paragraphLevel;
        bVar50 = true;
      }
      sVar22 = sVar22 - 1;
    } while (sVar22 != 0);
  }
  if (ctx->textlen != 0) {
    uVar23 = 0;
    do {
      if ((0x402c6U >> (ctx->origTypes[uVar23] & (CS|AN)) & 1) != 0) {
        puVar14 = &ctx->paragraphLevel;
        if (uVar23 != 0) {
          puVar14 = ctx->levels + (uVar23 - 1);
        }
        ctx->levels[uVar23] = *puVar14;
      }
      uVar23 = uVar23 + 1;
    } while (uVar23 < ctx->textlen);
  }
  sVar22 = ctx->textlen;
  if (sVar22 == 0) {
    uVar29 = 0;
  }
  else {
    puVar14 = ctx->levels;
    sVar44 = 0;
    do {
      if ((puVar14[sVar44] & 1) != 0) {
        puVar31 = &ctx->text[sVar44].wc;
        uVar29 = *puVar31;
        iVar35 = -1;
        iVar33 = 0x1ac;
        do {
          iVar41 = (iVar35 + iVar33) / 2;
          iVar9 = iVar41;
          if ((*(uint *)(mirror_glyph_mirror_pairs + (long)iVar41 * 8) <= uVar29) &&
             (iVar35 = iVar41, iVar9 = iVar33,
             uVar29 <= *(uint *)(mirror_glyph_mirror_pairs + (long)iVar41 * 8))) {
            uVar29 = *(uint *)(mirror_glyph_mirror_pairs + (long)iVar41 * 8 + 4);
            break;
          }
          iVar33 = iVar9;
        } while (1 < iVar33 - iVar35);
        *puVar31 = uVar29;
      }
      sVar44 = sVar44 + 1;
    } while (sVar44 != sVar22);
    uVar29 = 0;
    sVar44 = 0;
    do {
      uVar11 = (uint)ctx->levels[sVar44];
      if (ctx->levels[sVar44] < uVar29) {
        uVar11 = uVar29;
      }
      uVar29 = uVar11;
      sVar44 = sVar44 + 1;
    } while (sVar22 != sVar44);
  }
  do {
    if (uVar29 == 0) {
      return;
    }
    sVar22 = ctx->textlen;
    if (sVar22 != 0) {
      uVar23 = 0;
      do {
        uVar47 = uVar23;
        if (uVar29 <= ctx->levels[uVar23]) {
          uVar46 = uVar23 + 1;
          uVar26 = uVar46;
          uVar27 = uVar46;
          if (uVar46 < sVar22) {
            uVar27 = sVar22;
          }
          do {
            uVar40 = uVar26;
            uVar47 = uVar27;
            if (sVar22 <= uVar40) break;
            uVar26 = uVar40 + 1;
            uVar47 = uVar40;
          } while (uVar29 <= ctx->levels[uVar40]);
          uVar47 = uVar47 - 1;
          if (uVar23 < uVar47) {
            lVar48 = uVar47 * 0xc;
            lVar28 = uVar23 * 0xc;
            uVar23 = uVar47;
            do {
              pbVar7 = ctx->text;
              uVar4 = *(undefined4 *)((long)&pbVar7->index + lVar28);
              uVar34 = *(undefined8 *)((long)&pbVar7->origwc + lVar28);
              *(undefined8 *)((long)&pbVar7->origwc + lVar28) =
                   *(undefined8 *)((long)&pbVar7->origwc + lVar48);
              *(undefined4 *)((long)&pbVar7->index + lVar28) =
                   *(undefined4 *)((long)&pbVar7->index + lVar48);
              pbVar7 = ctx->text;
              *(undefined4 *)((long)&pbVar7->index + lVar48) = uVar4;
              *(undefined8 *)((long)&pbVar7->origwc + lVar48) = uVar34;
              uVar23 = uVar23 - 1;
              lVar48 = lVar48 + -0xc;
              lVar28 = lVar28 + 0xc;
              bVar50 = uVar46 < uVar23;
              uVar46 = uVar46 + 1;
            } while (bVar50);
          }
        }
        uVar23 = uVar47 + 1;
        sVar22 = ctx->textlen;
      } while (uVar23 < sVar22);
    }
    uVar29 = uVar29 - 1;
  } while( true );
}

Assistant:

void do_bidi_new(BidiContext *ctx, bidi_char *text, size_t textlen)
{
    ensure_arrays(ctx, textlen);
    ctx->text = text;
    ctx->textlen = textlen;
    setup_types(ctx);

    /* Quick initial test: see if we need to bother with any work at all */
    if (!text_needs_bidi(ctx))
        return;

    set_paragraph_level(ctx);
    process_explicit_embeddings(ctx);
    remove_embedding_characters(ctx);
    find_isolating_run_sequences(ctx, process_isolating_run_sequence);

    /* If this implementation distinguished paragraphs from lines,
     * then this would be the point where we repeat the remainder of
     * the algorithm once for each line in the paragraph. */

    reset_whitespace_and_separators(ctx);
    mirror_glyphs(ctx);
    reverse_sequences(ctx);
}